

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_SimQualityTest(Gia_Man_t *p)

{
  int iVar1;
  undefined8 in_RAX;
  Vec_Int_t *vPat;
  Vec_Int_t *p_00;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uStack_38;
  
  iVar1 = p->vCis->nSize;
  if (iVar1 < 0xb) {
    iVar5 = 0;
    uStack_38 = in_RAX;
    while (uStack_38 = CONCAT44(iVar5,(undefined4)uStack_38), iVar5 < 1 << ((byte)iVar1 & 0x1f)) {
      printf("%d : ");
      Extra_PrintBinary(_stdout,(uint *)((long)&uStack_38 + 4),p->vCis->nSize);
      putchar(0x20);
      vPat = Vec_IntAlloc(p->vCis->nSize);
      for (uVar4 = 0; (int)uVar4 < p->vCis->nSize; uVar4 = uVar4 + 1) {
        Vec_IntPush(vPat,(uint)((uStack_38._4_4_ >> (uVar4 & 0x1f) & 1) != 0));
      }
      p_00 = Gia_SimQualityOne(p,vPat,1);
      uVar3 = 0;
      uVar2 = (ulong)(uint)p_00->nSize;
      if (p_00->nSize < 1) {
        uVar2 = uVar3;
      }
      uVar6 = 0;
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        uVar6 = (ulong)(uint)((int)uVar6 + p_00->pArray[uVar3]);
      }
      printf("%d ",uVar6);
      Vec_IntFree(p_00);
      Vec_IntFree(vPat);
      putchar(10);
      iVar5 = uStack_38._4_4_ + 1;
    }
    return;
  }
  __assert_fail("Gia_ManCiNum(p) <= 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x659,"void Gia_SimQualityTest(Gia_Man_t *)");
}

Assistant:

void Gia_SimQualityTest( Gia_Man_t * p )
{
    Vec_Int_t * vPat, * vRes;
    int k, m, nMints = (1 << Gia_ManCiNum(p));
    assert( Gia_ManCiNum(p) <= 10 );
    for ( m = 0; m < nMints; m++ )
    {
        printf( "%d : ", m );
        Extra_PrintBinary( stdout, (unsigned*)&m, Gia_ManCiNum(p) );
        printf( " " );
        vPat = Vec_IntAlloc( Gia_ManCiNum(p) );
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            Vec_IntPush( vPat, (m >> k) & 1 );
        vRes = Gia_SimQualityOne( p, vPat, 1 );
        printf( "%d ", Vec_IntSum(vRes) );
        Vec_IntFree( vRes );
        Vec_IntFree( vPat );
        printf( "\n" );
    }
}